

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O3

uint __thiscall PermutazioneST::numeroInversioni(PermutazioneST *this,PermutazioneST *p)

{
  ushort *puVar1;
  ushort uVar2;
  unsigned_short *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = (p->super_Permutazione).dimensione;
  uVar4 = 0;
  if (1 < (ulong)uVar2) {
    puVar3 = (p->super_Permutazione).individuo;
    uVar5 = 0;
    uVar6 = 1;
    uVar4 = 0;
    do {
      puVar1 = puVar3 + uVar5;
      uVar5 = uVar5 + 1;
      uVar7 = uVar6;
      do {
        uVar4 = uVar4 + (puVar3[uVar7] < *puVar1);
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar2);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar2 - 1);
  }
  return uVar4;
}

Assistant:

unsigned int PermutazioneST::numeroInversioni(PermutazioneST& p) {

	unsigned int inv = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		for (unsigned short j = i + 1; j < p.dimensione; j++) {
			if (p.individuo[i] > p.individuo[j])
				inv++;
		}
	}

	return inv;
}